

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void value_release(t_symbol *s)

{
  int iVar1;
  t_pd *x;
  t_vcommon *c;
  t_symbol *s_local;
  
  x = pd_findbyclass(s,vcommon_class);
  if (x == (t_pd *)0x0) {
    bug("value_release");
  }
  else {
    iVar1 = *(int *)(x + 1);
    *(int *)(x + 1) = iVar1 + -1;
    if (iVar1 + -1 == 0) {
      pd_unbind(x,s);
      pd_free(x);
    }
  }
  return;
}

Assistant:

void value_release(t_symbol *s)
{
    t_vcommon *c = (t_vcommon *)pd_findbyclass(s, vcommon_class);
    if (c)
    {
        if (!--c->c_refcount)
        {
            pd_unbind(&c->c_pd, s);
            pd_free(&c->c_pd);
        }
    }
    else bug("value_release");
}